

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void LogLuv32toXYZ(uint32_t p,float *XYZ)

{
  float fVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = LogL16toY((int)p >> 0x10);
  if (dVar2 <= 0.0) {
    uVar4 = 0;
    fVar1 = 0.0;
  }
  else {
    dVar3 = ((double)(p >> 8 & 0xff) + 0.5) * 0.0024390243902439024;
    dVar5 = ((double)(p & 0xff) + 0.5) * 0.0024390243902439024;
    dVar6 = 1.0 / (dVar3 * 6.0 + dVar5 * -16.0 + 12.0);
    dVar3 = dVar6 * dVar3 * 9.0;
    dVar6 = dVar6 * dVar5 * 4.0;
    uVar4 = CONCAT44((float)dVar2,(float)((dVar3 / dVar6) * dVar2));
    fVar1 = (float)((((1.0 - dVar3) - dVar6) / dVar6) * dVar2);
  }
  *(undefined8 *)XYZ = uVar4;
  XYZ[2] = fVar1;
  return;
}

Assistant:

void
    LogLuv32toXYZ(uint32_t p, float *XYZ)
{
    double L, u, v, s, x, y;
    /* decode luminance */
    L = LogL16toY((int)p >> 16);
    if (L <= 0.)
    {
        XYZ[0] = XYZ[1] = XYZ[2] = 0.;
        return;
    }
    /* decode color */
    u = 1. / UVSCALE * ((p >> 8 & 0xff) + .5);
    v = 1. / UVSCALE * ((p & 0xff) + .5);
    s = 1. / (6. * u - 16. * v + 12.);
    x = 9. * u * s;
    y = 4. * v * s;
    /* convert to XYZ */
    XYZ[0] = (float)(x / y * L);
    XYZ[1] = (float)L;
    XYZ[2] = (float)((1. - x - y) / y * L);
}